

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O3

void __thiscall OpenMesh::PolyConnectivity::triangulate(PolyConnectivity *this)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar3;
  undefined1 local_38 [8];
  FaceIter f_it;
  mesh_ptr pPVar4;
  
  iVar1 = (*(this->super_ArrayKernel).super_BaseKernel._vptr_BaseKernel[5])();
  pPVar4 = (mesh_ptr)0xffffffff;
  if (CONCAT44(extraout_var,iVar1) != 0) {
    pPVar4 = (mesh_ptr)0x0;
  }
  local_38 = (undefined1  [8])this;
  f_it.mesh_ = pPVar4;
  uVar2 = (*(this->super_ArrayKernel).super_BaseKernel._vptr_BaseKernel[5])(this);
  iVar1 = (*(this->super_ArrayKernel).super_BaseKernel._vptr_BaseKernel[5])(this);
  uVar2 = -(uint)(CONCAT44(extraout_var_00,iVar1) == 0) | uVar2;
  if (uVar2 != (uint)pPVar4) {
    do {
      triangulate(this,(BaseHandle)(int)pPVar4);
      uVar3 = (uint)f_it.mesh_ + 1;
      f_it.mesh_ = (mesh_ptr)CONCAT44(f_it.mesh_._4_4_,uVar3);
      if (f_it.mesh_._4_4_ != 0) {
        Iterators::
        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
        ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                    *)local_38);
        uVar3 = (uint)f_it.mesh_;
      }
      pPVar4 = (mesh_ptr)(ulong)uVar3;
    } while ((local_38 != (undefined1  [8])this) || (uVar3 != uVar2));
  }
  return;
}

Assistant:

void PolyConnectivity::triangulate()
{
  /* The iterators will stay valid, even though new faces are added,
     because they are now implemented index-based instead of
     pointer-based.
  */
  FaceIter f_it(faces_begin()), f_end(faces_end());
  for (; f_it!=f_end; ++f_it)
    triangulate(*f_it);
}